

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executable.cpp
# Opt level: O0

bool fs_is_executable_binary(string_view path)

{
  bool bVar1;
  const_pointer pvVar2;
  pointer pvVar3;
  long lVar4;
  reference pvVar5;
  bool local_259;
  long local_230;
  ifstream f;
  array<char,_4UL> local_25;
  undefined1 local_21;
  undefined1 auStack_20 [3];
  array<char,_4UL> magic;
  bool ok;
  string_view path_local;
  
  _auStack_20 = path._M_len;
  local_21 = 0;
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
  std::ifstream::ifstream(&local_230,pvVar2,_S_bin);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)&local_230 + *(long *)(local_230 + -0x18)));
  if (bVar1) {
    pvVar3 = std::array<char,_4UL>::data(&local_25);
    std::istream::read((char *)&local_230,(long)pvVar3);
    lVar4 = std::istream::gcount();
    if (lVar4 == 4) {
      bVar1 = false;
    }
    else {
      path_local._M_str._7_1_ = 0;
      bVar1 = true;
    }
  }
  else {
    path_local._M_str._7_1_ = 0;
    bVar1 = true;
  }
  std::ifstream::~ifstream(&local_230);
  if (!bVar1) {
    pvVar5 = std::array<char,_4UL>::operator[](&local_25,0);
    local_259 = false;
    if (*pvVar5 == '\x7f') {
      pvVar5 = std::array<char,_4UL>::operator[](&local_25,1);
      local_259 = false;
      if (*pvVar5 == 'E') {
        pvVar5 = std::array<char,_4UL>::operator[](&local_25,2);
        local_259 = false;
        if (*pvVar5 == 'L') {
          pvVar5 = std::array<char,_4UL>::operator[](&local_25,3);
          local_259 = *pvVar5 == 'F';
        }
      }
    }
    path_local._M_str._7_1_ = local_259;
  }
  return (bool)(path_local._M_str._7_1_ & 1);
}

Assistant:

bool fs_is_executable_binary(std::string_view path)
{
  // is path a binary executable file as determined by the magic number
  // beginning the file.  This is a heuristic and may not be 100% accurate.
  bool ok = false;
#if defined(_WIN32)
  // MinGW, MSVC, oneAPI at least need || is_appexec_alias()
  DWORD t;
  ok = (GetBinaryTypeA(path.data(), &t) != 0) || fs_is_appexec_alias(path);
#else
  // https://github.com/jart/cosmopolitan/blob/master/ape/specification.md

  std::array<char, 4> magic;

  if(std::ifstream f{path.data(), std::ios::binary}){
    if(f.read(magic.data(), 4).gcount() != 4)
      return false;
  } else
    return false;

#if defined(__APPLE__)
  // https://ss64.com/mac/file.html
    // Mach-O magic numbers
    // https://stackoverflow.com/q/27669766
    // https://jonasdevlieghere.com/post/macho-4gb-limit/
    // MH_MAGIC: 0xfeedface (32-bit)
    // MH_MAGIC_64: 0xfeedfacf (64-bit)
    // FAT_MAGIC: 0xCAFEBABE (32-bit)
    // FAT_MAGIC_64: 0xCAFEBABF (64-bit)
    // it's necessary to consider the reversed magic number for each of these as well,
    // done in the "*CIGAM*" constants

  std::uint32_t um32;
  std::memcpy(&um32, magic.data(), sizeof(um32));

  ok = um32 == MH_MAGIC ||  um32 == MH_MAGIC_64 ||
       um32 == MH_CIGAM ||  um32 == MH_CIGAM_64 ||
       um32 == FAT_MAGIC || um32 == FAT_MAGIC_64 ||
       um32 == FAT_CIGAM || um32 == FAT_CIGAM_64;

#else
  // Linux / BSD: executable binary check via ELF file magic number
    ok = magic[0] == 0x7f && magic[1] == 'E' && magic[2] == 'L' && magic[3] == 'F';
  // does not consider PE or COFF formats.
#endif
#endif

  return ok;
}